

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

int wabt::anon_unknown_0::GetShiftMask(Type type)

{
  Enum EVar1;
  Type local_14;
  Type type_local;
  
  local_14 = type;
  EVar1 = Type::operator_cast_to_Enum(&local_14);
  if (EVar1 == I64) {
    type_local.enum_ = ~Void;
  }
  else {
    if (EVar1 != I32) {
      abort();
    }
    type_local.enum_ = ~Func;
  }
  return type_local.enum_;
}

Assistant:

int GetShiftMask(Type type) {
  // clang-format off
  switch (type) {
    case Type::I32: return 31;
    case Type::I64: return 63;
    default: WABT_UNREACHABLE; return 0;
  }
  // clang-format on
}